

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_has_vector_Test::~ObjectTest_basic_has_vector_Test
          (ObjectTest_basic_has_vector_Test *this)

{
  ObjectTest_basic_has_vector_Test *this_local;
  
  ~ObjectTest_basic_has_vector_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_has_vector) {
	object obj;

	EXPECT_FALSE(obj.has<std::vector<bool>>());
	EXPECT_FALSE(obj.has<std::vector<signed char>>());
	EXPECT_FALSE(obj.has<std::vector<unsigned char>>());
	EXPECT_FALSE(obj.has<std::vector<short>>());
	EXPECT_FALSE(obj.has<std::vector<int>>());
	EXPECT_FALSE(obj.has<std::vector<long>>());
	EXPECT_FALSE(obj.has<std::vector<long long>>());
	EXPECT_FALSE(obj.has<std::vector<intmax_t>>());
	EXPECT_FALSE(obj.has<std::vector<float>>());
	EXPECT_FALSE(obj.has<std::vector<double>>());
	EXPECT_FALSE(obj.has<std::vector<long double>>());
	EXPECT_FALSE(obj.has<std::vector<std::u8string>>());
	EXPECT_FALSE(obj.has<std::vector<object>>());
}